

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetTracerExpDestroyPrologue
          (ZETHandleLifetimeValidation *this,zet_tracer_exp_handle_t hTracer)

{
  long lVar1;
  bool bVar2;
  iterator iVar3;
  _Hashtable<_zet_tracer_exp_handle_t_*,_std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_tracer_exp_handle_t_*>,_std::hash<_zet_tracer_exp_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  long lVar4;
  long *plVar5;
  key_type local_28;
  
  lVar1 = context;
  this_00 = (_Hashtable<_zet_tracer_exp_handle_t_*,_std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_tracer_exp_handle_t_*>,_std::hash<_zet_tracer_exp_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(*(long *)(context + 0xd48) + 0x718);
  if (hTracer == (zet_tracer_exp_handle_t)0x0) {
    local_28 = (zet_tracer_exp_handle_t)0x0;
  }
  else {
    local_28 = hTracer;
    iVar3 = std::
            _Hashtable<_zet_tracer_exp_handle_t_*,_std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_tracer_exp_handle_t_*>,_std::hash<_zet_tracer_exp_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,&local_28);
    if (iVar3.
        super__Node_iterator_base<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      bVar2 = HandleLifetimeValidation::hasDependents
                        (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hTracer);
      if (!bVar2) {
        lVar4 = *(long *)(lVar1 + 0xd48);
        plVar5 = *(long **)(lVar4 + 0xbf8);
        local_28 = hTracer;
        if (plVar5 != (long *)0x0) {
          do {
            std::
            _Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase((_Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)(plVar5 + 2),&local_28);
            plVar5 = (long *)*plVar5;
          } while (plVar5 != (long *)0x0);
          lVar4 = *(long *)(lVar1 + 0xd48);
        }
        local_28 = hTracer;
        std::
        _Hashtable<_zet_tracer_exp_handle_t_*,_std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_tracer_exp_handle_t_*>,_std::hash<_zet_tracer_exp_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase((_Hashtable<_zet_tracer_exp_handle_t_*,_std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_tracer_exp_handle_t_*>,_std::hash<_zet_tracer_exp_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(lVar4 + 0x718));
        return ZE_RESULT_SUCCESS;
      }
      return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
    }
    this_00 = &((*(HandleLifetimeValidation **)(lVar1 + 0xd48))->tracerExpHandleStateMap)._M_h;
    local_28 = hTracer;
  }
  iVar3 = std::
          _Hashtable<_zet_tracer_exp_handle_t_*,_std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_tracer_exp_handle_t_*>,_std::hash<_zet_tracer_exp_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_00,&local_28);
  if (iVar3.
      super__Node_iterator_base<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    return ZE_RESULT_SUCCESS;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetTracerExpDestroyPrologue(
        zet_tracer_exp_handle_t hTracer                 ///< [in][release] handle of tracer object to destroy
        )
    { 
        
        if (hTracer && context.handleLifetime->isHandleValid( hTracer )){
            if (context.handleLifetime->hasDependents( hTracer )){
                return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
            }
            context.handleLifetime->removeDependent( hTracer);
            context.handleLifetime->removeHandle( hTracer );
        } else if (!context.handleLifetime->isHandleValid( hTracer )) {
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }